

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

void __thiscall
btRaycastVehicle::updateWheelTransformsWS
          (btRaycastVehicle *this,btWheelInfo *wheel,bool interpolatedTransform)

{
  btRigidBody *pbVar1;
  btMotionState *pbVar2;
  byte in_DL;
  long in_RSI;
  btRaycastVehicle *in_RDI;
  btVector3 bVar3;
  btTransform chassisTrans;
  btTransform *in_stack_ffffffffffffff68;
  btTransform *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  btTransform local_54;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  *(undefined1 *)(in_RSI + 0x54) = 0;
  local_10 = in_RSI;
  getChassisWorldTransform((btRaycastVehicle *)0x233b20);
  btTransform::btTransform((btTransform *)in_RDI,in_stack_ffffffffffffff68);
  if ((local_11 & 1) != 0) {
    pbVar1 = getRigidBody(in_RDI);
    pbVar2 = btRigidBody::getMotionState(pbVar1);
    if (pbVar2 != (btMotionState *)0x0) {
      pbVar1 = getRigidBody(in_RDI);
      pbVar2 = btRigidBody::getMotionState(pbVar1);
      (*pbVar2->_vptr_btMotionState[2])(pbVar2,&local_54);
    }
  }
  this_00 = &local_54;
  bVar3 = btTransform::operator()
                    ((btTransform *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *(long *)(local_10 + 0x24) = bVar3.m_floats._0_8_;
  *(long *)(local_10 + 0x2c) = bVar3.m_floats._8_8_;
  btTransform::getBasis(this_00);
  bVar3 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (btVector3 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  *(long *)(local_10 + 0x34) = bVar3.m_floats._0_8_;
  *(long *)(local_10 + 0x3c) = bVar3.m_floats._8_8_;
  btTransform::getBasis(this_00);
  bVar3 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (btVector3 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  *(long *)(local_10 + 0x44) = bVar3.m_floats._0_8_;
  *(long *)(local_10 + 0x4c) = bVar3.m_floats._8_8_;
  return;
}

Assistant:

void	btRaycastVehicle::updateWheelTransformsWS(btWheelInfo& wheel , bool interpolatedTransform)
{
	wheel.m_raycastInfo.m_isInContact = false;

	btTransform chassisTrans = getChassisWorldTransform();
	if (interpolatedTransform && (getRigidBody()->getMotionState()))
	{
		getRigidBody()->getMotionState()->getWorldTransform(chassisTrans);
	}

	wheel.m_raycastInfo.m_hardPointWS = chassisTrans( wheel.m_chassisConnectionPointCS );
	wheel.m_raycastInfo.m_wheelDirectionWS = chassisTrans.getBasis() *  wheel.m_wheelDirectionCS ;
	wheel.m_raycastInfo.m_wheelAxleWS = chassisTrans.getBasis() * wheel.m_wheelAxleCS;
}